

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.h
# Opt level: O2

cbtScalar __thiscall
cbtCollisionWorld::AllHitsRayResultCallback::addSingleResult
          (AllHitsRayResultCallback *this,LocalRayResult *rayResult,bool normalInWorldSpace)

{
  undefined1 auVar1 [16];
  undefined7 in_register_00000011;
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [64];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar4;
  cbtVector3 hitPointWorld;
  cbtVector3 local_48;
  cbtVector3 local_30;
  undefined1 auVar3 [56];
  
  auVar3 = in_ZMM0._8_56_;
  (this->super_RayResultCallback).m_collisionObject = rayResult->m_collisionObject;
  cbtAlignedObjectArray<const_cbtCollisionObject_*>::push_back
            (&this->m_collisionObjects,&rayResult->m_collisionObject);
  if ((int)CONCAT71(in_register_00000011,normalInWorldSpace) == 0) {
    cVar4 = ::operator*(&(((this->super_RayResultCallback).m_collisionObject)->m_worldTransform).
                         m_basis,&rayResult->m_hitNormalLocal);
    auVar2._0_8_ = cVar4.m_floats._0_8_;
    auVar2._8_56_ = auVar3;
    auVar1._8_8_ = in_XMM1_Qb;
    auVar1._0_8_ = cVar4.m_floats._8_8_;
    local_48.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar2._0_16_,auVar1);
  }
  else {
    local_48.m_floats = *&(rayResult->m_hitNormalLocal).m_floats;
  }
  cbtAlignedObjectArray<cbtVector3>::push_back(&this->m_hitNormalWorld,&local_48);
  cbtVector3::setInterpolate3
            (&local_30,&this->m_rayFromWorld,&this->m_rayToWorld,rayResult->m_hitFraction);
  cbtAlignedObjectArray<cbtVector3>::push_back(&this->m_hitPointWorld,&local_30);
  cbtAlignedObjectArray<float>::push_back(&this->m_hitFractions,&rayResult->m_hitFraction);
  return (this->super_RayResultCallback).m_closestHitFraction;
}

Assistant:

virtual cbtScalar addSingleResult(LocalRayResult& rayResult, bool normalInWorldSpace)
		{
			m_collisionObject = rayResult.m_collisionObject;
			m_collisionObjects.push_back(rayResult.m_collisionObject);
			cbtVector3 hitNormalWorld;
			if (normalInWorldSpace)
			{
				hitNormalWorld = rayResult.m_hitNormalLocal;
			}
			else
			{
				///need to transform normal into worldspace
				hitNormalWorld = m_collisionObject->getWorldTransform().getBasis() * rayResult.m_hitNormalLocal;
			}
			m_hitNormalWorld.push_back(hitNormalWorld);
			cbtVector3 hitPointWorld;
			hitPointWorld.setInterpolate3(m_rayFromWorld, m_rayToWorld, rayResult.m_hitFraction);
			m_hitPointWorld.push_back(hitPointWorld);
			m_hitFractions.push_back(rayResult.m_hitFraction);
			return m_closestHitFraction;
		}